

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O2

bool google::protobuf::internal::WireFormat::ParseAndMergeMessageSetItem
               (CodedInputStream *input,Message *message)

{
  uint8 *puVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  uint32 tag;
  undefined4 extraout_var;
  FieldDescriptor *field;
  uint32 tag_00;
  uint32 length;
  StringOutputStream output_stream;
  string message_data;
  CodedOutputStream coded_output;
  string temp;
  
  iVar4 = (*(message->super_MessageLite)._vptr_MessageLite[0x12])(message);
  message_data._M_dataplus._M_p = (pointer)&message_data.field_2;
  message_data._M_string_length = 0;
  message_data.field_2._M_local_buf[0] = '\0';
  tag_00 = 0;
  field = (FieldDescriptor *)0x0;
LAB_00225994:
  do {
    puVar1 = input->buffer_;
    if ((puVar1 < input->buffer_end_) && (tag = (uint32)(char)*puVar1, -1 < (char)*puVar1)) {
      input->last_tag_ = tag;
      input->buffer_ = puVar1 + 1;
    }
    else {
      tag = io::CodedInputStream::ReadTagFallback(input);
      input->last_tag_ = tag;
    }
    if (tag == 0x1a) {
      if (tag_00 == 0) {
        temp._M_dataplus._M_p = (pointer)&temp.field_2;
        temp._M_string_length = 0;
        temp.field_2._M_local_buf[0] = '\0';
        bVar3 = io::CodedInputStream::ReadVarint32(input,&length);
        if ((!bVar3) || (bVar3 = io::CodedInputStream::ReadString(input,&temp,length), !bVar3)) {
          std::__cxx11::string::~string((string *)&temp);
          goto LAB_00225b72;
        }
        io::StringOutputStream::StringOutputStream(&output_stream,&message_data);
        io::CodedOutputStream::CodedOutputStream
                  (&coded_output,&output_stream.super_ZeroCopyOutputStream);
        io::CodedOutputStream::WriteVarint32(&coded_output,length);
        io::CodedOutputStream::WriteString(&coded_output,&temp);
        io::CodedOutputStream::~CodedOutputStream(&coded_output);
        io::StringOutputStream::~StringOutputStream(&output_stream);
        std::__cxx11::string::~string((string *)&temp);
        tag_00 = 0;
        goto LAB_00225994;
      }
      bVar3 = ParseAndMergeField(tag_00,field,message,input);
    }
    else {
      if (tag == 0) goto LAB_00225b72;
      if (tag == 0xc) {
        bVar3 = true;
        goto LAB_00225b74;
      }
      if (tag == 0x10) {
        bVar3 = io::CodedInputStream::ReadVarint32(input,(uint32 *)&output_stream);
        iVar2 = (int)output_stream.super_ZeroCopyOutputStream._vptr_ZeroCopyOutputStream;
        if (!bVar3) goto LAB_00225b72;
        field = (FieldDescriptor *)
                (**(code **)(*(long *)CONCAT44(extraout_var,iVar4) + 0x218))
                          ((long *)CONCAT44(extraout_var,iVar4),
                           (int)output_stream.super_ZeroCopyOutputStream._vptr_ZeroCopyOutputStream)
        ;
        tag_00 = iVar2 * 8 + 2;
        if (message_data._M_string_length != 0) {
          io::ArrayInputStream::ArrayInputStream
                    ((ArrayInputStream *)&coded_output,message_data._M_dataplus._M_p,
                     (int)message_data._M_string_length,-1);
          io::CodedInputStream::CodedInputStream
                    ((CodedInputStream *)&temp,(ZeroCopyInputStream *)&coded_output);
          bVar3 = ParseAndMergeField(tag_00,field,message,(CodedInputStream *)&temp);
          if (!bVar3) {
            io::CodedInputStream::~CodedInputStream((CodedInputStream *)&temp);
            io::ArrayInputStream::~ArrayInputStream((ArrayInputStream *)&coded_output);
            goto LAB_00225b72;
          }
          message_data._M_string_length = 0;
          *message_data._M_dataplus._M_p = '\0';
          io::CodedInputStream::~CodedInputStream((CodedInputStream *)&temp);
          io::ArrayInputStream::~ArrayInputStream((ArrayInputStream *)&coded_output);
        }
        goto LAB_00225994;
      }
      bVar3 = SkipField(input,tag,(UnknownFieldSet *)0x0);
    }
    if (bVar3 == false) {
LAB_00225b72:
      bVar3 = false;
LAB_00225b74:
      std::__cxx11::string::~string((string *)&message_data);
      return bVar3;
    }
  } while( true );
}

Assistant:

bool WireFormat::ParseAndMergeMessageSetItem(
    io::CodedInputStream* input,
    Message* message) {
  const Reflection* message_reflection = message->GetReflection();

  // This method parses a group which should contain two fields:
  //   required int32 type_id = 2;
  //   required data message = 3;

  // Once we see a type_id, we'll construct a fake tag for this extension
  // which is the tag it would have had under the proto2 extensions wire
  // format.
  uint32 fake_tag = 0;

  // Once we see a type_id, we'll look up the FieldDescriptor for the
  // extension.
  const FieldDescriptor* field = NULL;

  // If we see message data before the type_id, we'll append it to this so
  // we can parse it later.
  string message_data;

  while (true) {
    uint32 tag = input->ReadTag();
    if (tag == 0) return false;

    switch (tag) {
      case WireFormatLite::kMessageSetTypeIdTag: {
        uint32 type_id;
        if (!input->ReadVarint32(&type_id)) return false;
        fake_tag = WireFormatLite::MakeTag(
            type_id, WireFormatLite::WIRETYPE_LENGTH_DELIMITED);
        field = message_reflection->FindKnownExtensionByNumber(type_id);

        if (!message_data.empty()) {
          // We saw some message data before the type_id.  Have to parse it
          // now.
          io::ArrayInputStream raw_input(message_data.data(),
                                         message_data.size());
          io::CodedInputStream sub_input(&raw_input);
          if (!ParseAndMergeField(fake_tag, field, message,
                                  &sub_input)) {
            return false;
          }
          message_data.clear();
        }

        break;
      }

      case WireFormatLite::kMessageSetMessageTag: {
        if (fake_tag == 0) {
          // We haven't seen a type_id yet.  Append this data to message_data.
          string temp;
          uint32 length;
          if (!input->ReadVarint32(&length)) return false;
          if (!input->ReadString(&temp, length)) return false;
          io::StringOutputStream output_stream(&message_data);
          io::CodedOutputStream coded_output(&output_stream);
          coded_output.WriteVarint32(length);
          coded_output.WriteString(temp);
        } else {
          // Already saw type_id, so we can parse this directly.
          if (!ParseAndMergeField(fake_tag, field, message, input)) {
            return false;
          }
        }

        break;
      }

      case WireFormatLite::kMessageSetItemEndTag: {
        return true;
      }

      default: {
        if (!SkipField(input, tag, NULL)) return false;
      }
    }
  }
}